

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
 __thiscall
kj::
Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
          (Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
           *this,SchemaBindingsPair *params)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ArrayPtr<const_unsigned_char> s;
  int local_28;
  int local_24;
  
  if (*(long *)(this + 0x38) == 0) {
    return (Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
            )(Entry *)0x0;
  }
  lVar2 = *(long *)this;
  _local_28 = CONCAT44((int)((ulong)params->scopeBindings >> 0x20) * 0xbfe3 +
                       (int)params->scopeBindings,
                       (int)((ulong)params->schema >> 0x20) * 0xbfe3 + (int)params->schema);
  s.size_ = 8;
  s.ptr = (uchar *)&local_28;
  uVar5 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  uVar6 = _::chooseBucket((uint)(uVar5 != 0),*(uint *)(this + 0x38));
  lVar3 = *(long *)(this + 0x30);
  uVar7 = (ulong)uVar6;
  uVar8 = *(uint *)(lVar3 + 4 + uVar7 * 8);
  if (uVar8 != 0) {
    puVar10 = (uint *)(lVar3 + uVar7 * 8);
    do {
      if ((uVar8 != 1) && (*puVar10 == (uint)(uVar5 != 0))) {
        piVar1 = (int *)(lVar2 + (ulong)(uVar8 - 2) * 0x18);
        auVar11._0_4_ = -(uint)(*piVar1 == *(int *)&params->schema);
        auVar11._4_4_ = -(uint)(piVar1[1] == *(int *)((long)&params->schema + 4));
        auVar11._8_4_ = -(uint)(piVar1[2] == *(int *)&params->scopeBindings);
        auVar11._12_4_ = -(uint)(piVar1[3] == *(int *)((long)&params->scopeBindings + 4));
        auVar12._4_4_ = auVar11._0_4_;
        auVar12._0_4_ = auVar11._4_4_;
        auVar12._8_4_ = auVar11._12_4_;
        auVar12._12_4_ = auVar11._8_4_;
        iVar9 = movmskpd((int)puVar10,auVar12 & auVar11);
        if (iVar9 == 3) {
          return (Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
                  )(Entry *)((ulong)(uVar8 - 2) * 0x18 + *(long *)this);
        }
      }
      uVar4 = uVar7 + 1;
      uVar7 = uVar4 & 0xffffffff;
      if (uVar4 == *(ulong *)(this + 0x38)) {
        uVar7 = 0;
      }
      puVar10 = (uint *)(lVar3 + uVar7 * 8);
      uVar8 = puVar10[1];
    } while (uVar8 != 0);
  }
  return (Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
          )(Entry *)0x0;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }